

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O0

void lisp_Xvideocolor(int flag)

{
  unsigned_long local_160;
  unsigned_long newForeground;
  XGCValues gcv;
  XEvent event;
  int flag_local;
  
  memset(&gcv.dash_offset,0,0xc0);
  memset(&newForeground,0,0x80);
  if (flag == 0) {
    local_160 = foregroundPixel;
  }
  else {
    local_160 = backgroundPixel;
  }
  XGetGCValues(currentdsp->display_id,currentdsp->Copy_GC,0xc,&newForeground);
  if (local_160 != gcv.plane_mask) {
    gcv.foreground = gcv.plane_mask;
    gcv.plane_mask = local_160;
    XChangeGC(currentdsp->display_id,currentdsp->Copy_GC,0xc,&newForeground);
    gcv.dash_offset = 0xc;
    XSendEvent(currentdsp->display_id,currentdsp->DisplayWindow,1,0,&gcv.dash_offset);
  }
  XFlush(currentdsp->display_id);
  return;
}

Assistant:

void lisp_Xvideocolor(int flag)
{
  XEvent event = {0};
  XGCValues gcv = {0};
  unsigned long newForeground;

  XLOCK;
  newForeground = flag ? backgroundPixel : foregroundPixel;

  /* window -- are we making a change? */
  XGetGCValues(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
  if (newForeground != gcv.foreground) {
      /* swap foreground and background in the graphics context*/
      gcv.background = gcv.foreground;
      gcv.foreground = newForeground;
      XChangeGC(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
      /* notify the display code to refresh the visible screen with new fg/bg colors */
      event.type = Expose;
      event.xexpose.window = currentdsp->DisplayWindow;
      event.xexpose.x = 0;
      event.xexpose.y = 0;
      event.xexpose.width = (int)currentdsp->Visible.width;
      event.xexpose.height = (int)currentdsp->Visible.height;
      XSendEvent(currentdsp->display_id, currentdsp->DisplayWindow, True, 0, &event);
  }

  XFlush(currentdsp->display_id);
  XUNLOCK(currentdsp);

}